

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

Layer * __thiscall ncnn::Net::create_overwrite_builtin_layer(Net *this,int typeindex)

{
  pointer poVar1;
  code *pcVar2;
  Layer *pLVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  pointer poVar7;
  
  poVar1 = (this->d->overwrite_builtin_layer_registry).
           super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->d->overwrite_builtin_layer_registry).
                super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)poVar1;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 5;
    lVar5 = 0;
    lVar6 = 0;
    poVar7 = poVar1;
    do {
      if (poVar7->typeindex == typeindex) {
        if ((int)lVar6 == -1) {
          return (Layer *)0x0;
        }
        pcVar2 = *(code **)((long)&poVar1->creator + (lVar5 >> 0x1b));
        if (pcVar2 == (code *)0x0) {
          return (Layer *)0x0;
        }
        pLVar3 = (Layer *)(*pcVar2)(*(undefined8 *)((long)&poVar1->userdata + (lVar5 >> 0x1b)));
        pLVar3->typeindex = typeindex;
        return pLVar3;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x100000000;
      poVar7 = poVar7 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar6);
  }
  return (Layer *)0x0;
}

Assistant:

Layer* Net::create_overwrite_builtin_layer(int typeindex)
{
    int index = -1;
    const size_t overwrite_builtin_layer_registry_entry_count = d->overwrite_builtin_layer_registry.size();
    for (size_t i = 0; i < overwrite_builtin_layer_registry_entry_count; i++)
    {
        if (d->overwrite_builtin_layer_registry[i].typeindex == typeindex)
        {
            index = i;
            break;
        }
    }

    if (index == -1)
        return 0;

    layer_creator_func layer_creator = d->overwrite_builtin_layer_registry[index].creator;
    if (!layer_creator)
        return 0;

    Layer* layer = layer_creator(d->overwrite_builtin_layer_registry[index].userdata);
    layer->typeindex = typeindex;
    return layer;
}